

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

void __thiscall S2Polygon::InitLoopProperties(S2Polygon *this)

{
  int iVar1;
  int iVar2;
  S2Loop *pSVar3;
  S2LatLngRect local_c8;
  S2LatLngRect local_90;
  S2LatLngRect local_68;
  int local_3c;
  undefined1 local_38 [4];
  int i;
  S2Polygon *local_10;
  S2Polygon *this_local;
  
  this->num_vertices_ = 0;
  local_10 = this;
  S2LatLngRect::Empty();
  S2LatLngRect::operator=(&this->bound_,(S2LatLngRect *)local_38);
  S2LatLngRect::~S2LatLngRect((S2LatLngRect *)local_38);
  local_3c = 0;
  while( true ) {
    iVar2 = local_3c;
    iVar1 = num_loops(this);
    if (iVar1 <= iVar2) break;
    pSVar3 = loop(this,local_3c);
    iVar2 = S2Loop::depth(pSVar3);
    if (iVar2 == 0) {
      pSVar3 = loop(this,local_3c);
      S2Loop::GetRectBound(&local_90,pSVar3);
      S2LatLngRect::Union(&local_68,&this->bound_,&local_90);
      S2LatLngRect::operator=(&this->bound_,&local_68);
      S2LatLngRect::~S2LatLngRect(&local_68);
      S2LatLngRect::~S2LatLngRect(&local_90);
    }
    pSVar3 = loop(this,local_3c);
    iVar2 = S2Loop::num_vertices(pSVar3);
    this->num_vertices_ = iVar2 + this->num_vertices_;
    local_3c = local_3c + 1;
  }
  S2LatLngRectBounder::ExpandForSubregions(&local_c8,&this->bound_);
  S2LatLngRect::operator=(&this->subregion_bound_,&local_c8);
  S2LatLngRect::~S2LatLngRect(&local_c8);
  InitIndex(this);
  return;
}

Assistant:

void S2Polygon::InitLoopProperties() {
  num_vertices_ = 0;
  bound_ = S2LatLngRect::Empty();
  for (int i = 0; i < num_loops(); ++i) {
    if (loop(i)->depth() == 0) {
      bound_ = bound_.Union(loop(i)->GetRectBound());
    }
    num_vertices_ += loop(i)->num_vertices();
  }
  subregion_bound_ = S2LatLngRectBounder::ExpandForSubregions(bound_);
  InitIndex();
}